

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.c
# Opt level: O3

void sim(void)

{
  char cVar1;
  _func_Card_ptr_ptr_unsigned_long_ptr *p_Var2;
  _func_Board_ptr_Card_ptr_ptr_unsigned_long *p_Var3;
  _func_MovePack_ptr_Board_ptr *p_Var4;
  pthread_t __th;
  Move *pMVar5;
  long lVar6;
  Results RVar7;
  uchar cardsCount_00;
  int iVar8;
  int iVar9;
  Results *pRVar10;
  Card **cards;
  Board *pBVar11;
  char *pcVar12;
  MovePack *movePack;
  char *pcVar13;
  unsigned_long uVar14;
  Results *__newthread;
  Results *pRVar15;
  ulong uVar16;
  ulong uVar17;
  code *pcVar18;
  int iVar19;
  bool bVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar23 [16];
  undefined1 in_ZMM1 [64];
  undefined8 auStack_a8 [2];
  int iStack_94;
  double adStack_90 [2];
  ulong auStack_80 [4];
  Results aRStack_60 [2];
  Results *results;
  Results *local_48;
  unsigned_long local_40;
  unsigned_long cardsCount;
  
  lVar6 = -(gConfig.threadCount * 8 + 0xf & 0xfffffffffffffff0);
  results = (Results *)((long)aRStack_60 + lVar6 + 8);
  *(undefined8 *)((long)aRStack_60 + lVar6) = 0x107174;
  pRVar10 = results_create();
  local_40 = 0;
  p_Var2 = (gConfig.game)->deckCreate;
  if (p_Var2 == (_func_Card_ptr_ptr_unsigned_long_ptr *)0x0) {
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x10719c;
    cards = game_deckCreate(&local_40);
  }
  else {
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x107195;
    cards = (*p_Var2)(&local_40);
  }
  if (gConfig.json == true) {
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1071b4;
    printf("{\"deck\":");
    cardsCount_00 = (uchar)local_40;
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1071c0;
    cards_printAsDeck(cards,cardsCount_00);
  }
  uVar14 = local_40;
  p_Var3 = (gConfig.game)->boardCreate;
  *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1071d1;
  pBVar11 = (*p_Var3)(cards,uVar14);
  cardsCount = (unsigned_long)pBVar11;
  *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1071dd;
  pBVar11 = board_dup(pBVar11);
  *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1071e8;
  free(cards);
  if ((gConfig.json == false) && (gConfig.printSolution == false)) {
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x107207;
    pcVar12 = comma_print(gConfig.iterationCount);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x107218;
    printf("\x1b[35mTotal Iterations: \x1b[36m%s\x1b[0m\n",pcVar12);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x107221;
    pcVar12 = comma_print(gConfig.maxDepth);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x107232;
    printf("\x1b[35m   Maximum Depth: \x1b[36m%s\x1b[0m\n",pcVar12);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x10723b;
    pcVar12 = comma_print(gConfig.threadCount);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x10724c;
    printf("\x1b[35m    Thread Count: \x1b[36m%s\x1b[0m\n",pcVar12);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x107256;
    putchar(10);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x10726b;
    printf("\x1b[35m            Game: \x1b[36m%s\x1b[0m\n",(gConfig.game)->idname);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x10727d;
    printf("\x1b[35m            Seed: \x1b[36m%u\x1b[0m\n");
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x107287;
    putchar(10);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x107293;
    puts("\x1b[35m           Board: \x1b[0m");
    uVar14 = cardsCount;
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1072a1;
    board_print((Board *)uVar14,false);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1072ab;
    putchar(10);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1072b7;
    puts("\x1b[35m  Starting Moves:\x1b[0m");
    p_Var4 = (gConfig.game)->movePackGet;
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1072c4;
    movePack = (*p_Var4)((Board *)uVar14);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1072d7;
    movePack_print((Board *)uVar14,movePack,false);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1072e7;
    movePack_free(movePack,true);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1072f1;
    putchar(10);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1072fd;
    puts("\x1b[37m        <<<=== \x1b[32mRUNNING\x1b[37m ===>>>\x1b[0m");
  }
  uVar14 = cardsCount;
  auVar23 = in_ZMM1._0_16_;
  auVar22 = in_ZMM0._0_16_;
  if (gConfig.threadCount < 2) {
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x107397;
    pRVar10 = (Results *)depthFirstThread((void *)uVar14);
  }
  else {
    pcVar18 = depthFirstThread;
    uVar17 = 0;
    __newthread = results;
    local_48 = pRVar10;
    do {
      uVar14 = cardsCount;
      pRVar15 = (Results *)0x0;
      *(undefined8 *)((long)aRStack_60 + lVar6) = 0x10732e;
      iVar8 = pthread_create(&__newthread->winCount,(pthread_attr_t *)0x0,depthFirstThread,
                             (void *)uVar14);
      pRVar10 = local_48;
      auVar23 = in_ZMM1._0_16_;
      auVar22 = in_ZMM0._0_16_;
      if (iVar8 != 0) {
        *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1074cf;
        sim_cold_1();
        goto LAB_001074cf;
      }
      uVar17 = uVar17 + 1;
      __newthread = __newthread + 1;
    } while (uVar17 < gConfig.threadCount);
    if (gConfig.threadCount != 0) {
      pcVar18 = (code *)(aRStack_60 + 1);
      uVar17 = 0;
      do {
        __th = results[uVar17].winCount;
        *(undefined8 *)((long)aRStack_60 + lVar6) = 0x107366;
        pRVar15 = (Results *)pcVar18;
        iVar8 = pthread_join(__th,(void **)pcVar18);
        RVar7.winCount = aRStack_60[1].winCount;
        __newthread = pRVar10;
        if (iVar8 != 0) goto LAB_001074cf;
        *(undefined8 *)((long)aRStack_60 + lVar6) = 0x10737a;
        results_add((Results *)RVar7.winCount,pRVar10);
        RVar7.winCount = aRStack_60[1].winCount;
        *(undefined8 *)((long)aRStack_60 + lVar6) = 0x107383;
        results_free((Results *)RVar7.winCount);
        auVar23 = in_ZMM1._0_16_;
        auVar22 = in_ZMM0._0_16_;
        uVar17 = uVar17 + 1;
      } while (uVar17 < gConfig.threadCount);
    }
  }
  if (gConfig.json == false) {
    uVar14 = pRVar10->winCount;
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1073d9;
    pcVar12 = comma_print(uVar14);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1073e8;
    pcVar13 = comma_print(gConfig.iterationCount);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1073ff;
    printf("\x1b[35m       Win Count: \x1b[33m%s\x1b[35m out of \x1b[33m%s\x1b[0m\n",pcVar12,pcVar13
          );
    auVar22 = vcvtusi2sd_avx512f(auVar22,pRVar10->winCount);
    auVar23 = vcvtusi2sd_avx512f(auVar23,gConfig.iterationCount);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x107427;
    printf("\x1b[35m  Win Percentage: \x1b[33m%0.4f%%\x1b[0m\n",
           (auVar22._0_8_ / auVar23._0_8_) * 100.0);
  }
  else {
    uVar14 = pRVar10->winCount;
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1073c3;
    printf(",\"seed\":%u,\"wins\":%lu,\"games\":%lu",(ulong)gConfig.seed,uVar14,
           gConfig.iterationCount);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1073cf;
    puts("}");
  }
  if ((gConfig.printSolution == true) && (winningMoves != (MovePack *)0x0)) {
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x107447;
    puts("\nWinning moves:");
    uVar14 = winningMoves->movesCount;
    do {
      pMVar5 = winningMoves->moves[uVar14 - 1];
      *(undefined8 *)((long)aRStack_60 + lVar6) = 0x10746e;
      move_print(pBVar11,pMVar5,true);
      pMVar5 = winningMoves->moves[uVar14 - 1];
      *(undefined8 *)((long)aRStack_60 + lVar6) = 0x107486;
      board_moveMake(pBVar11,pMVar5);
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
    *(undefined8 *)((long)aRStack_60 + lVar6) = 0x10749c;
    movePack_free(winningMoves,true);
  }
  uVar14 = cardsCount;
  *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1074a8;
  board_free((Board *)uVar14);
  *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1074b0;
  board_free(pBVar11);
  *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1074b8;
  results_free(pRVar10);
  return;
LAB_001074cf:
  *(undefined8 *)((long)aRStack_60 + lVar6) = 0x1074d7;
  uVar16 = uVar17;
  sim_cold_2();
  *(undefined1 **)((long)aRStack_60 + lVar6) = &stack0xfffffffffffffff8;
  *(Board **)((long)auStack_80 + lVar6 + 0x18) = pBVar11;
  *(Config **)((long)auStack_80 + lVar6 + 0x10) = &gConfig;
  *(code **)((long)auStack_80 + lVar6 + 8) = pcVar18;
  *(ulong *)((long)auStack_80 + lVar6) = uVar17;
  *(Results **)((long)adStack_90 + lVar6 + 8) = __newthread;
  *(undefined8 *)((long)auStack_a8 + lVar6) = 0x1074f1;
  dVar21 = getTicks();
  *(double *)((long)adStack_90 + lVar6) = dVar21;
  *(undefined8 *)((long)auStack_a8 + lVar6) = 0x1074fc;
  games_load();
  gConfig.json = false;
  gConfig.iterationCount = 0;
  *(undefined8 *)((long)auStack_a8 + lVar6) = 0x107517;
  gConfig.threadCount = sysconf(0x54);
  gConfig.seed = 0;
  gConfig.maxDepth = 0;
  gConfig.game = (Game *)0x0;
  gConfig.printSolution = false;
  iVar19 = 1;
  iVar8 = (int)uVar16;
  if (1 < iVar8) {
    *(int *)((long)&iStack_94 + lVar6) = iVar8 + -1;
    do {
      pcVar12 = (char *)pRVar15[iVar19].winCount;
      if (*pcVar12 == '-') {
        cVar1 = pcVar12[1];
        if (cVar1 == 'h') {
          if (pcVar12[2] != '\0') goto LAB_0010757a;
          goto LAB_001077a4;
        }
        *(undefined8 *)((long)auStack_a8 + lVar6) = 0x10761c;
        iVar9 = strcmp(pcVar12,"--help");
        if (iVar9 == 0) goto LAB_001077a4;
        if ((cVar1 == 'V') && (pcVar12[2] == '\0')) goto LAB_001077a9;
      }
      else {
LAB_0010757a:
        *(undefined8 *)((long)auStack_a8 + lVar6) = 0x107589;
        iVar9 = strcmp(pcVar12,"--help");
        if (iVar9 == 0) goto LAB_001077a4;
      }
      *(undefined8 *)((long)auStack_a8 + lVar6) = 0x1075a0;
      iVar9 = strcmp(pcVar12,"--version");
      if (iVar9 == 0) goto LAB_001077a9;
      *(undefined8 *)((long)auStack_a8 + lVar6) = 0x1075b7;
      iVar9 = strcmp(pcVar12,"--json");
      if (iVar9 == 0) {
        gConfig.json = true;
      }
      else {
        *(undefined8 *)((long)auStack_a8 + lVar6) = 0x1075ca;
        iVar9 = strcmp(pcVar12,"--printSolution");
        if (iVar9 == 0) {
          gConfig.printSolution = true;
        }
        else {
          *(undefined8 *)((long)auStack_a8 + lVar6) = 0x1075dd;
          iVar9 = strcmp(pcVar12,"--iterations");
          if ((iVar19 == *(int *)((long)&iStack_94 + lVar6)) || (iVar9 != 0)) {
            *(undefined8 *)((long)auStack_a8 + lVar6) = 0x107658;
            iVar9 = strcmp(pcVar12,"--maxDepth");
            if ((iVar19 == *(int *)((long)&iStack_94 + lVar6)) || (iVar9 != 0)) {
              *(undefined8 *)((long)auStack_a8 + lVar6) = 0x107688;
              iVar9 = strcmp(pcVar12,"--threads");
              if ((iVar19 == *(int *)((long)&iStack_94 + lVar6)) || (iVar9 != 0)) {
                *(undefined8 *)((long)auStack_a8 + lVar6) = 0x1076b8;
                iVar9 = strcmp(pcVar12,"--seed");
                if ((iVar19 == *(int *)((long)&iStack_94 + lVar6)) || (iVar9 != 0)) break;
                pcVar12 = (char *)pRVar15[(long)iVar19 + 1].winCount;
                iVar19 = iVar19 + 1;
                *(undefined8 *)((long)auStack_a8 + lVar6) = 0x1076d0;
                gConfig.seed = atoi(pcVar12);
              }
              else {
                pcVar12 = (char *)pRVar15[(long)iVar19 + 1].winCount;
                iVar19 = iVar19 + 1;
                *(undefined8 *)((long)auStack_a8 + lVar6) = 0x1076a0;
                gConfig.threadCount = atol(pcVar12);
              }
            }
            else {
              pcVar12 = (char *)pRVar15[(long)iVar19 + 1].winCount;
              iVar19 = iVar19 + 1;
              *(undefined8 *)((long)auStack_a8 + lVar6) = 0x107670;
              gConfig.maxDepth = atol(pcVar12);
            }
          }
          else {
            pcVar12 = (char *)pRVar15[(long)iVar19 + 1].winCount;
            iVar19 = iVar19 + 1;
            *(undefined8 *)((long)auStack_a8 + lVar6) = 0x1075f5;
            gConfig.iterationCount = atol(pcVar12);
          }
        }
      }
      bVar20 = SCARRY4(iVar19,1);
      iVar19 = iVar19 + 1;
      if (bVar20) {
        pcVar18 = (code *)invalidInstructionException();
        (*pcVar18)();
      }
    } while (iVar19 < iVar8);
  }
  if (SBORROW4(iVar8,iVar19)) {
    pcVar18 = (code *)invalidInstructionException();
    (*pcVar18)();
  }
  if (iVar8 != iVar19) {
    pcVar12 = (char *)pRVar15[iVar19].winCount;
    *(undefined8 *)((long)auStack_a8 + lVar6) = 0x107703;
    gConfig.game = find_game(pcVar12);
    if (gConfig.game != (Game *)0x0) {
      if (gConfig.iterationCount == 0) {
        gConfig.iterationCount = (gConfig.game)->defaultIterationsCount;
      }
      if (gConfig.iterationCount < gConfig.threadCount) {
        gConfig.threadCount = 1;
      }
      if (gConfig.maxDepth == 0) {
        gConfig.maxDepth = (gConfig.game)->defaultMaxDepth;
      }
      *(undefined8 *)((long)auStack_a8 + lVar6) = 0x107764;
      randinit(gConfig.seed);
      *(undefined8 *)((long)auStack_a8 + lVar6) = 0x107769;
      sim();
      if (gConfig.json == false) {
        *(undefined8 *)((long)auStack_a8 + lVar6) = 0x107777;
        dVar21 = getTicks();
        *(undefined8 *)((long)auStack_a8 + lVar6) = 0x107793;
        printf("\x1b[37m        <<<===   \x1b[32mDONE \x1b[31m%0.2f seconds\x1b[37m  ===>>>\x1b[0m\n"
               ,(dVar21 - *(double *)((long)adStack_90 + lVar6)) / 1000.0);
      }
      return;
    }
  }
LAB_001077a4:
  *(undefined8 *)((long)auStack_a8 + lVar6) = 0x1077a9;
  usage();
LAB_001077a9:
  *(undefined8 *)((long)auStack_a8 + lVar6) = 0x1077be;
  printf("sim %s\n","0.0.1");
  *(undefined8 *)((long)auStack_a8 + lVar6) = 0x1077c5;
  exit(0);
}

Assistant:

void sim(void)
{
	unsigned long i;
	pthread_t threads[gConfig.threadCount];
	Board * startBoard;
	Board * winningStartBoard;
	Results * results;
	Results * totalResults = results_create();
	Card ** cards;
	MovePack * movePack;
	unsigned long cardsCount=0;

	if(gConfig.game->deckCreate==0)
		cards = game_deckCreate(&cardsCount);
	else
		cards = gConfig.game->deckCreate(&cardsCount);

	if(gConfig.json)
	{
		printf("{\"deck\":");
		cards_printAsDeck(cards, cardsCount);
	}

	startBoard = gConfig.game->boardCreate(cards, cardsCount);
	winningStartBoard = board_dup(startBoard);
	free(cards);
	
	// Debug section for new game
	/*board_print(startBoard, false);
	printf("====\n");
	unsigned char movesToMake[] = {0,0,1,1,0,1,1,0,0,0,0,0,0,1};
	for(i=0;i<sizeof(movesToMake);i++)
	{
		board_moveMake(startBoard, gConfig.game->movePackGet(startBoard)->moves[movesToMake[i]]);
	}
	board_print(startBoard, false);
	movePack_print(startBoard, gConfig.game->movePackGet(startBoard), false);
	exit(0);*/

	if(!gConfig.json && !gConfig.printSolution)
	{
		printf(C_MAGENTA "Total Iterations: " C_CYAN "%s" C_RESET "\n", comma_print(gConfig.iterationCount));
		printf(C_MAGENTA "   Maximum Depth: " C_CYAN "%s" C_RESET "\n", comma_print(gConfig.maxDepth));
		printf(C_MAGENTA "    Thread Count: " C_CYAN "%s" C_RESET "\n", comma_print(gConfig.threadCount));
		printf("\n");
		printf(C_MAGENTA "            Game: " C_CYAN "%s" C_RESET "\n", gConfig.game->idname);
		printf(C_MAGENTA "            Seed: " C_CYAN "%u" C_RESET "\n", gConfig.seed);
		printf("\n");
		printf(C_MAGENTA "           Board: " C_RESET "\n");
		board_print(startBoard, false);
		printf("\n");
		printf(C_MAGENTA "  Starting Moves:" C_RESET "\n");
		movePack = gConfig.game->movePackGet(startBoard);
		movePack_print(startBoard, movePack, false);
		movePack_free(movePack, true);
		printf("\n");

		printf(C_WHITE "        <<<=== " C_GREEN "RUNNING" C_WHITE " ===>>>" C_RESET "\n");
	}

	if(gConfig.threadCount>1)
	{
		for(i=0;i<gConfig.threadCount;i++)
		{
			if(pthread_create(&threads[i], 0, depthFirstThread, startBoard)!=0)
			{
				fprintf(stderr, "Error creating thread %lu!\n", i);
				exit(EXIT_FAILURE);
			}
		}
		
		for(i=0;i<gConfig.threadCount;i++)
		{
			if(pthread_join(threads[i], (void **)&results)!=0)
			{
				fprintf(stderr, "Error joining thread %lu!\n", i);
				exit(EXIT_FAILURE);
			}

			results_add(results, totalResults);
			results_free(results);
		}
	}
	else
	{
		totalResults = depthFirstThread(startBoard);
	}


	if(!gConfig.json)
	{
		printf(C_MAGENTA "       Win Count: " C_YELLOW "%s" C_MAGENTA " out of " C_YELLOW "%s" C_RESET "\n", comma_print(totalResults->winCount), comma_print(gConfig.iterationCount));
		printf(C_MAGENTA "  Win Percentage: " C_YELLOW "%0.4f%%" C_RESET "\n", ((double)totalResults->winCount/(double)gConfig.iterationCount)*100);
	}
	else
	{
		printf(",\"seed\":%u,\"wins\":%lu,\"games\":%lu", gConfig.seed, totalResults->winCount, gConfig.iterationCount);
		printf("}\n");
	}

	if(gConfig.printSolution && winningMoves!=0)
	{
		printf("\nWinning moves:\n");
		i = winningMoves->movesCount-1;
		do
		{
			//board_print(winningStartBoard, false);
			move_print(winningStartBoard, winningMoves->moves[i], true);
			board_moveMake(winningStartBoard, winningMoves->moves[i]);
			if(i==0)
				break;

			i--;
		} while(true);

		movePack_free(winningMoves, true);
	}

	board_free(startBoard);
	board_free(winningStartBoard);
	results_free(totalResults);
}